

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::canTestStreamOverflow
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLint counterBits;
  int local_c;
  
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar1) {
    iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
              m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0xa28))(0x82ed,0x8864,&local_c);
    bVar1 = 0 < local_c;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool canTestStreamOverflow()
	{
		if (supportsTransformFeedback3())
		{
			const glw::Functions& gl = m_context.getRenderContext().getFunctions();
			GLint				  counterBits;

			gl.getQueryiv(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, GL_QUERY_COUNTER_BITS, &counterBits);

			return counterBits > 0;
		}
		else
		{
			return false;
		}
	}